

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.h
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::clear_int64classlabels(TreeEnsembleClassifier *this)

{
  ulong uVar1;
  Int64Vector *this_00;
  undefined8 *puVar2;
  
  if (this->_oneof_case_[0] == 0x65) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 == (undefined8 *)0x0) {
      this_00 = (this->ClassLabels_).int64classlabels_;
      if (this_00 != (Int64Vector *)0x0) {
        Int64Vector::~Int64Vector(this_00);
      }
      operator_delete(this_00,0x28);
    }
    this->_oneof_case_[0] = 0;
  }
  return;
}

Assistant:

inline bool TreeEnsembleClassifier::_internal_has_int64classlabels() const {
  return ClassLabels_case() == kInt64ClassLabels;
}